

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDException.hpp
# Opt level: O0

void __thiscall OpenMD::OpenMDException::~OpenMDException(OpenMDException *this)

{
  OpenMDException *in_RDI;
  
  ~OpenMDException(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

~OpenMDException() throw() {}